

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall r_comp::Compiler::hlp_reference(Compiler *this,Ptr *node,uint16_t *index)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  byte bVar4;
  
  bVar2 = std::operator!=(&((node->
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->label,"");
  if (!bVar2) {
    for (bVar4 = 0;
        pbVar1 = (this->hlp_references).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (ulong)bVar4 <
        (ulong)((long)(this->hlp_references).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        bVar4 = bVar4 + 1) {
      _Var3 = std::operator==(&((node->
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->cmd,pbVar1 + bVar4);
      if (_Var3) {
        *index = (ushort)bVar4;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Compiler::hlp_reference(RepliStruct::Ptr node, uint16_t &index)
{
    if (node->label != "") {
        return false;
    }

    for (uint8_t i = 0; i < hlp_references.size(); ++i) {
        if (node->cmd == hlp_references[i]) {
            index = i;
            return true;
        }
    }

    return false;
}